

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

local_lu_map_t * __thiscall
tchecker::clockbounds::local_lu_map_t::operator=(local_lu_map_t *this,local_lu_map_t *m)

{
  const_reference ppmVar1;
  map_t *pmVar2;
  reference ppmVar3;
  uint local_2c;
  value_type pmStack_28;
  loc_id_t id;
  value_type local_20;
  local_lu_map_t *local_18;
  local_lu_map_t *m_local;
  local_lu_map_t *this_local;
  
  if (this != m) {
    local_18 = m;
    m_local = this;
    clear(this);
    this->_loc_nb = local_18->_loc_nb;
    this->_clock_nb = local_18->_clock_nb;
    local_20 = (value_type)0x0;
    std::
    vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ::resize(&this->_L,(ulong)this->_loc_nb,&local_20);
    pmStack_28 = (value_type)0x0;
    std::
    vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ::resize(&this->_U,(ulong)this->_loc_nb,&stack0xffffffffffffffd8);
    for (local_2c = 0; local_2c < this->_loc_nb; local_2c = local_2c + 1) {
      ppmVar1 = std::
                vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ::operator[](&local_18->_L,(ulong)local_2c);
      pmVar2 = clone_map(*ppmVar1);
      ppmVar3 = std::
                vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ::operator[](&this->_L,(ulong)local_2c);
      *ppmVar3 = pmVar2;
      ppmVar1 = std::
                vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ::operator[](&local_18->_U,(ulong)local_2c);
      pmVar2 = clone_map(*ppmVar1);
      ppmVar3 = std::
                vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                ::operator[](&this->_U,(ulong)local_2c);
      *ppmVar3 = pmVar2;
    }
  }
  return this;
}

Assistant:

tchecker::clockbounds::local_lu_map_t & local_lu_map_t::operator=(tchecker::clockbounds::local_lu_map_t const & m)
{
  if (this != &m) {
    clear();

    _loc_nb = m._loc_nb;
    _clock_nb = m._clock_nb;
    _L.resize(_loc_nb, nullptr);
    _U.resize(_loc_nb, nullptr);
    for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
      _L[id] = tchecker::clockbounds::clone_map(*m._L[id]);
      _U[id] = tchecker::clockbounds::clone_map(*m._U[id]);
    }
  }
  return *this;
}